

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest::TestCompression
          (ZLIBBufferCompressorTest *this,string *text,uint32_t chunk_size)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  AssertHelper AStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  void *local_38 [2];
  long local_28;
  
  pcVar2 = (text->_M_dataplus)._M_p;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_38,pcVar2,
             pcVar2 + text->_M_string_length,(allocator_type *)&local_80);
  TestCompression(&local_50,this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                  chunk_size);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((string *)&local_80,
             local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_60,"text","std::string(result.begin(), result.end())",text,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_80._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38[0] != (void *)0x0) {
    operator_delete(local_38[0],local_28 - (long)local_38[0]);
  }
  return;
}

Assistant:

void ZLIBBufferCompressorTest::TestCompression(std::string& text, uint32_t chunk_size)
{
    std::vector<unsigned char> bytes = std::vector<unsigned char>(&text[0], &text[0] + text.size());
    std::vector<unsigned char> result = TestCompression(bytes, chunk_size);
    EXPECT_EQ(text, std::string(result.begin(), result.end()));
}